

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_mount.c
# Opt level: O3

LY_ERR lyplg_ext_schema_mount_get_parent_ref(lysc_ext_instance *ext,ly_set **refs)

{
  LY_ERR LVar1;
  ly_set *set;
  ulong uVar2;
  ulong uVar3;
  ly_bool ext_data_free;
  ly_set *snode_set;
  ly_set *pref_set;
  ly_set *results_set;
  char *value;
  lyd_node *ext_data;
  ly_err_item *err;
  ly_bool local_61;
  ly_set *local_60;
  ly_set *local_58;
  ly_set *local_50;
  char *local_48;
  lyd_node *local_40;
  ly_err_item *local_38;
  
  local_58 = (ly_set *)0x0;
  local_60 = (ly_set *)0x0;
  local_50 = (ly_set *)0x0;
  LVar1 = lyplg_ext_get_data(ext->module->ctx,ext,&local_40,&local_61);
  if (LVar1 != LY_SUCCESS) {
    return LVar1;
  }
  LVar1 = schema_mount_get_parent_ref(ext,local_40,&local_58);
  if (LVar1 == LY_SUCCESS) {
    if (local_58->count != 0) {
      LVar1 = ly_set_new(&local_50);
      if (LVar1 != LY_SUCCESS) goto LAB_0019e0f4;
      if (local_58->count != 0) {
        uVar2 = 0;
        do {
          LVar1 = lyplg_type_print_xpath10_value
                            ((lyd_value_xpath10 *)(local_58->field_2).dnodes[uVar2][1].parent,
                             LY_VALUE_JSON,(void *)0x0,&local_48,&local_38);
          if (LVar1 != LY_SUCCESS) goto LAB_0019e0f4;
          LVar1 = lys_find_xpath(ext->module->ctx,(lysc_node *)0x0,local_48,0,&local_60);
          free(local_48);
          if (LVar1 != LY_SUCCESS) goto LAB_0019e0f4;
          if (local_60->count != 0) {
            uVar3 = 0;
            do {
              LVar1 = ly_set_add(local_50,(local_60->field_2).dnodes[uVar3],'\0',(uint32_t *)0x0);
              if (LVar1 != LY_SUCCESS) goto LAB_0019e0f4;
              uVar3 = uVar3 + 1;
            } while (uVar3 < local_60->count);
          }
          ly_set_free(local_60,(_func_void_void_ptr *)0x0);
          local_60 = (ly_set *)0x0;
          uVar2 = uVar2 + 1;
        } while (uVar2 < local_58->count);
      }
      *refs = local_50;
    }
    set = (ly_set *)0x0;
    LVar1 = LY_SUCCESS;
  }
  else {
LAB_0019e0f4:
    ly_set_free(local_50,(_func_void_void_ptr *)0x0);
    set = local_60;
  }
  ly_set_free(set,(_func_void_void_ptr *)0x0);
  if (local_61 != '\0') {
    lyd_free_all(local_40);
  }
  ly_set_free(local_58,(_func_void_void_ptr *)0x0);
  return LVar1;
}

Assistant:

LY_ERR
lyplg_ext_schema_mount_get_parent_ref(const struct lysc_ext_instance *ext, struct ly_set **refs)
{
    LY_ERR rc;
    struct ly_set *pref_set = NULL;
    struct ly_set *snode_set = NULL;
    struct ly_set *results_set = NULL;
    struct lyd_node *ext_data;
    ly_bool ext_data_free;

    /* get operational data with ietf-yang-library and ietf-yang-schema-mount data */
    if ((rc = lyplg_ext_get_data(ext->module->ctx, ext, (void **)&ext_data, &ext_data_free))) {
        return rc;
    }

    LY_CHECK_GOTO(rc = schema_mount_get_parent_ref(ext, ext_data, &pref_set), cleanup);
    if (pref_set->count == 0) {
        goto cleanup;
    }

    LY_CHECK_GOTO(rc = ly_set_new(&results_set), cleanup);

    for (uint32_t i = 0; i < pref_set->count; ++i) {
        struct lyd_node_term *term;
        struct lyd_value_xpath10 *xp_val;
        char *value;
        struct ly_err_item *err;

        term = (struct lyd_node_term *)pref_set->dnodes[i];
        LYD_VALUE_GET(&term->value, xp_val);
        LY_CHECK_GOTO(rc = lyplg_type_print_xpath10_value(xp_val, LY_VALUE_JSON, NULL, &value, &err), cleanup);
        LY_CHECK_ERR_GOTO(rc = lys_find_xpath(ext->module->ctx, NULL, value, 0, &snode_set), free(value), cleanup);
        free(value);
        for (uint32_t sn = 0; sn < snode_set->count; sn++) {
            LY_CHECK_GOTO(rc = ly_set_add(results_set, snode_set->snodes[sn], 0, NULL), cleanup);
        }
        ly_set_free(snode_set, NULL);
        snode_set = NULL;
    }

    *refs = results_set;

cleanup:
    if (rc) {
        ly_set_free(results_set, NULL);
    }
    ly_set_free(snode_set, NULL);
    if (ext_data_free) {
        lyd_free_all(ext_data);
    }
    ly_set_free(pref_set, NULL);

    return rc;
}